

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O3

Sat_MmFlex_t * Sat_MmFlexStart(void)

{
  Sat_MmFlex_t *pSVar1;
  char **ppcVar2;
  
  pSVar1 = (Sat_MmFlex_t *)calloc(1,0x38);
  pSVar1->nChunkSize = 0x10000;
  pSVar1->nChunksAlloc = 0x40;
  ppcVar2 = (char **)malloc(0x200);
  pSVar1->pChunks = ppcVar2;
  return pSVar1;
}

Assistant:

Sat_MmFlex_t * Sat_MmFlexStart()
{
    Sat_MmFlex_t * p;

    p = ABC_ALLOC( Sat_MmFlex_t, 1 );
    memset( p, 0, sizeof(Sat_MmFlex_t) );

    p->nEntriesUsed  = 0;
    p->pCurrent      = NULL;
    p->pEnd          = NULL;

    p->nChunkSize    = (1 << 16);
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );

    p->nMemoryUsed   = 0;
    p->nMemoryAlloc  = 0;
    return p;
}